

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

void vector_push_back(vector_t *vec,size_t value)

{
  size_t *psVar1;
  size_t value_local;
  vector_t *vec_local;
  
  if (vec->size == vec->capacity) {
    vec->capacity = vec->capacity << 1;
    psVar1 = (size_t *)realloc(vec->values,vec->capacity << 3);
    vec->values = psVar1;
    if (vec->values == (size_t *)0x0) {
      fprintf(_stderr,"Fatal error in %s at line %d: Exiting",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/MathisRosenhauer[P]libaec/src/vector.c"
              ,0x3b);
      exit(1);
    }
  }
  vec->values[vec->size] = value;
  vec->size = vec->size + 1;
  return;
}

Assistant:

void vector_push_back(struct vector_t *vec, size_t value)
{
  if (vec->size == vec->capacity) {
    vec->capacity *= VECTOR_GROWTH_FACTOR;
    vec->values = realloc(vec->values, sizeof(*vec->values) * vec->capacity);
    if (vec->values == NULL)
      VECTOR_FATAL_ERROR("Failed to reallocate memory for vector values\n");
  }
  vec->values[vec->size] = value;
  vec->size++;
}